

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printSomething.cpp
# Opt level: O1

int main(void)

{
  pointer pcVar1;
  long *plVar2;
  MatchTool *pMVar3;
  long *plVar4;
  size_type *psVar5;
  MatchTable mt;
  string id;
  string integer;
  string digit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string number;
  string letter;
  string ws;
  undefined1 local_188 [24];
  vector<MatchTool,_std::allocator<MatchTool>_> vStack_170;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"( |\t|\n|\r)+","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)"
             ,"");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"(1|2|3|4|5|6|7|8|9|0)","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                 "(+|-)?",&local_110);
  plVar2 = (long *)std::__cxx11::string::append(local_188);
  local_130 = &local_120;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_120 = *plVar4;
    lStack_118 = plVar2[3];
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  pcVar1 = local_188 + 0x10;
  if ((pointer)local_188._0_8_ != pcVar1) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,local_130,local_128 + (long)local_130);
  std::__cxx11::string::append((char *)local_f0);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_f0,(ulong)local_110._M_dataplus._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_140 = *plVar4;
    lStack_138 = plVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar4;
    local_150 = (long *)*plVar2;
  }
  local_148 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    local_188._16_8_ = *psVar5;
    vStack_170.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)plVar2[3];
    local_188._0_8_ = pcVar1;
  }
  else {
    local_188._16_8_ = *psVar5;
    local_188._0_8_ = (size_type *)*plVar2;
  }
  local_188._8_8_ = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(local_188);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((pointer)local_188._0_8_ != pcVar1) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                 "(_|",&local_b0);
  plVar2 = (long *)std::__cxx11::string::append(local_188);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_140 = *plVar4;
    lStack_138 = plVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar4;
    local_150 = (long *)*plVar2;
  }
  local_148 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((pointer)local_188._0_8_ != pcVar1) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  vStack_170.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_170.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._16_8_ = 0;
  vStack_170.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = (pointer)0x0;
  MatchTable::add((MatchTable *)local_188,(char *)local_90[0]);
  MatchTable::add((MatchTable *)local_188,(char *)local_150);
  MatchTable::add((MatchTable *)local_188,(char *)local_d0);
  MatchTable::generate((MatchTable *)local_188);
  pMVar3 = MatchTable::getTool((MatchTable *)local_188,0);
  print_tool(pMVar3,(ostream *)&std::cout);
  pMVar3 = MatchTable::getTool((MatchTable *)local_188,1);
  print_tool(pMVar3,(ostream *)&std::cout);
  pMVar3 = MatchTable::getTool((MatchTable *)local_188,2);
  print_tool(pMVar3,(ostream *)&std::cout);
  std::vector<MatchTool,_std::allocator<MatchTool>_>::~vector(&vStack_170);
  if ((pointer)local_188._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    string ws = "( |\t|\n|\r)+";
    string letter = "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z"
                    "|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)";
    string digit = "(1|2|3|4|5|6|7|8|9|0)";
    string integer = "(+|-)?" + digit + "+";
    string number = integer + "(\\." + digit + "+)?" + "((e|E)" + integer + "+)?";
    string id = "(_|" + letter + ")+";

    MatchTable mt;
    mt.add(ws.c_str());
    mt.add(id.c_str());
    mt.add(number.c_str());
    mt.generate();

    print_tool(mt.getTool(0), cout);
    print_tool(mt.getTool(1), cout);
    print_tool(mt.getTool(2), cout);

}